

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthExistSet(uint *pRes,uint *pTruth,int nVars,uint uMask)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  if (0 < (int)uVar1) {
    lVar2 = (ulong)uVar1 + 1;
    do {
      pRes[lVar2 + -2] = pTruth[lVar2 + -2];
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  if (0 < nVars) {
    uVar1 = 0;
    do {
      if ((uMask >> (uVar1 & 0x1f) & 1) != 0) {
        Kit_TruthExist(pRes,nVars,uVar1);
      }
      uVar1 = uVar1 + 1;
    } while (nVars != uVar1);
  }
  return;
}

Assistant:

void Kit_TruthExistSet( unsigned * pRes, unsigned * pTruth, int nVars, unsigned uMask )
{
    int v;
    Kit_TruthCopy( pRes, pTruth, nVars );
    for ( v = 0; v < nVars; v++ )
        if ( uMask & (1 << v) )
            Kit_TruthExist( pRes, nVars, v );
}